

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

double __thiscall VCClusterAnisoQuad::energyWithoutItem(VCClusterAnisoQuad *this,VCFace *f)

{
  double dVar1;
  ResScalar RVar2;
  ResScalar RVar3;
  Vector3d zi;
  Vector3d sKP;
  Matrix4d Eo;
  Matrix3d sK;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  local_150;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_128 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_110 [24];
  undefined1 local_f8 [8];
  Matrix3d *local_f0;
  
  dVar1 = 0.0;
  if (1 < (this->super_VCClusterAniso).super_VCCluster.items._M_t._M_impl.super__Rb_tree_header.
          _M_node_count) {
    local_f8 = (undefined1  [8])&(this->super_VCClusterAniso).sumK;
    local_f0 = &f->K;
    Eigen::internal::
    assign_LinearTraversal_CompleteUnrolling<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0,_9>
    ::run((Matrix<double,_3,_3,_0,_3,_3> *)&stack0xffffffffffffff88,
          (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
           *)local_f8);
    local_f8 = (undefined1  [8])&(this->super_VCClusterAniso).sumKPos;
    local_150.m_rhs = (RhsNested)&f->center;
    local_150.m_lhs = (LhsNested)&f->K;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    lazyAssign<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_f0,
               (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
                *)&local_150);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>const>>
              (local_110,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>_>
                *)local_f8);
    local_150.m_lhs = &(this->super_VCClusterAniso).super_VCCluster.E;
    local_150.m_rhs = &f->E;
    Eigen::internal::
    assign_innervec_CompleteUnrolling<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0,_16>
    ::run((Matrix<double,_4,_4,_0,_4,_4> *)local_f8,&local_150);
    center((Vector3d *)local_128,this,(Matrix<double,_4,_4,_0,_4,_4> *)local_f8,
           (Matrix3d *)&stack0xffffffffffffff88,(Vector3d *)local_110);
    local_150.m_lhs = (LhsNested)&stack0xffffffffffffff88;
    local_150.m_rhs = (RhsNested)local_128;
    RVar2 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>,_false>
            ::run(local_128,
                  (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
                   *)&local_150);
    RVar3 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run(local_128,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_110);
    dVar1 = RVar2 - (RVar3 + RVar3);
  }
  return dVar1;
}

Assistant:

double VCClusterAnisoQuad::energyWithoutItem(VCFace* f) {
	if (items.size() <= 1)
		return ENG_NULL;
	Matrix3d sK = sumK - f->K;
	Vector3d sKP = sumKPos - f->K * f->center;
	Matrix4d Eo = E - f->E;
	Vector3d zi = center(Eo, sK, sKP);
	return zi.dot(sK * zi) - 2 * zi.dot(sKP);
}